

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O0

void text_out_e(char *fmt,...)

{
  char in_AL;
  _Bool _Var1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_938 [8];
  undefined8 local_930;
  undefined8 local_928;
  undefined8 local_920;
  undefined8 local_918;
  undefined8 local_910;
  undefined8 local_908;
  undefined8 local_8f8;
  undefined8 local_8e8;
  undefined8 local_8d8;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  char local_888 [8];
  char tagbuffer [16];
  int local_86c;
  ulong uStack_868;
  wchar_t a;
  size_t taglen;
  size_t textlen;
  char *tag;
  char *text;
  char *next;
  char *start;
  va_list vp;
  char local_818 [8];
  char smallbuf [1024];
  char buf [1024];
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_908 = in_XMM0_Qa;
    local_8f8 = in_XMM1_Qa;
    local_8e8 = in_XMM2_Qa;
    local_8d8 = in_XMM3_Qa;
    local_8c8 = in_XMM4_Qa;
    local_8b8 = in_XMM5_Qa;
    local_8a8 = in_XMM6_Qa;
    local_898 = in_XMM7_Qa;
  }
  uStack_868 = 0;
  vp[0].overflow_arg_area = local_938;
  vp[0]._0_8_ = &stack0x00000008;
  start._4_4_ = 0x30;
  start._0_4_ = 8;
  local_930 = in_RSI;
  local_928 = in_RDX;
  local_920 = in_RCX;
  local_918 = in_R8;
  local_910 = in_R9;
  vstrnfmt(smallbuf + 0x3f8,0x400,fmt,(__va_list_tag *)&start);
  next = smallbuf + 0x3f8;
  do {
    _Var1 = next_section(next,0,&tag,&taglen,(char **)&textlen,&stack0xfffffffffffff798,&text);
    if (!_Var1) {
      return;
    }
    local_86c = -1;
    memcpy(local_818,tag,taglen);
    local_818[taglen] = '\0';
    if (textlen != 0) {
      if (0xf < uStack_868) {
        __assert_fail("taglen < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-textblock.c"
                      ,0x2a6,"void text_out_e(const char *, ...)");
      }
      memcpy(local_888,(void *)textlen,uStack_868);
      local_888[uStack_868] = '\0';
      local_86c = color_text_to_attr(local_888);
    }
    if (local_86c == -1) {
      local_86c = 1;
    }
    (*text_out_hook)((uint8_t)local_86c,local_818);
    next = text;
  } while( true );
}

Assistant:

void text_out_e(const char *fmt, ...)
{
	char buf[1024];
	char smallbuf[1024];
	va_list vp;

	const char *start, *next, *text, *tag;
	size_t textlen, taglen = 0;

	/* Begin the Varargs Stuff */
	va_start(vp, fmt);

	/* Do the va_arg fmt to the buffer */
	(void)vstrnfmt(buf, sizeof(buf), fmt, vp);

	/* End the Varargs Stuff */
	va_end(vp);

	start = buf;
	while (next_section(start, 0, &text, &textlen, &tag, &taglen, &next)) {
		int a = -1;

		memcpy(smallbuf, text, textlen);
		smallbuf[textlen] = 0;

		if (tag) {
			char tagbuffer[16];

			/* Colour names are less than 16 characters long. */
			assert(taglen < 16);

			memcpy(tagbuffer, tag, taglen);
			tagbuffer[taglen] = '\0';

			a = color_text_to_attr(tagbuffer);
		}
		
		if (a == -1) 
			a = COLOUR_WHITE;

		/* Output now */
		text_out_hook(a, smallbuf);

		start = next;
	}
}